

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

double gl4cts::Math::sign<double>(double t)

{
  return (double)(-(ulong)(t < 0.0) & 0xbff0000000000000 |
                 ~-(ulong)(t < 0.0) & ~-(ulong)(t == 0.0) & 0x3ff0000000000000);
}

Assistant:

static T sign(T t)
{
	if (0 > t)
	{
		return -1;
	}
	else if (0 == t)
	{
		return 0;
	}
	else
	{
		return 1;
	}
}